

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O0

int coda__pcre2_study_8(pcre2_real_code_8 *re)

{
  byte bVar1;
  int iVar2;
  int local_284;
  int local_278 [2];
  int backref_cache [129];
  int min;
  int d;
  uint8_t y;
  int c;
  uint8_t x;
  uint8_t *puStack_50;
  uint32_t flags;
  uint8_t *p;
  uint local_40;
  int b;
  int a;
  int i;
  int rc;
  int depth;
  BOOL ucp;
  BOOL utf;
  PCRE2_UCHAR8 *code;
  pcre2_real_code_8 *ppStack_18;
  int count;
  pcre2_real_code_8 *re_local;
  
  code._4_4_ = 0;
  depth = (int)((re->overall_options & 0x80000) != 0);
  rc = (int)((re->overall_options & 0x20000) != 0);
  _ucp = re[1].start_bitmap + (long)(int)((uint)re->name_entry_size * (uint)re->name_count) + -0x28;
  ppStack_18 = re;
  if ((re->flags & 0x210) == 0) {
    i = 0;
    iVar2 = set_start_bits(re,_ucp,depth,rc,&i);
    if (iVar2 == 3) {
      return 1;
    }
    if (iVar2 == 1) {
      local_40 = 0xffffffff;
      p._4_4_ = 0xffffffff;
      puStack_50 = ppStack_18->start_bitmap;
      c = 0x40;
      for (b = 0; b < 0x100; b = b + 8) {
        bVar1 = *puStack_50;
        if (bVar1 != 0) {
          if ((bVar1 & (bVar1 ^ 0xff) + 1) != bVar1) goto LAB_0017a2f4;
          d = b;
          if (bVar1 != 1) {
            if (bVar1 == 2) {
              d = b + 1;
            }
            else if (bVar1 == 4) {
              d = b + 2;
            }
            else if (bVar1 == 8) {
              d = b + 3;
            }
            else if (bVar1 == 0x10) {
              d = b + 4;
            }
            else if (bVar1 == 0x20) {
              d = b + 5;
            }
            else if (bVar1 == 0x40) {
              d = b + 6;
            }
            else if (bVar1 == 0x80) {
              d = b + 7;
            }
          }
          if ((depth != 0) && (0x7f < d)) goto LAB_0017a2f4;
          if ((int)local_40 < 0) {
            local_40 = d;
          }
          else {
            if ((-1 < (int)p._4_4_) || (ppStack_18->tables[(ulong)(uint)d + 0x100] != local_40))
            goto LAB_0017a2f4;
            p._4_4_ = d;
          }
        }
        puStack_50 = puStack_50 + 1;
      }
      if ((-1 < (int)local_40) &&
         (((ppStack_18->flags & 0x80) == 0 ||
          ((ppStack_18->last_codeunit != local_40 &&
           (((int)p._4_4_ < 0 || (ppStack_18->last_codeunit != p._4_4_)))))))) {
        ppStack_18->first_codeunit = local_40;
        c = 0x10;
        if (-1 < (int)p._4_4_) {
          c = 0x30;
        }
      }
LAB_0017a2f4:
      ppStack_18->flags = c | ppStack_18->flags;
    }
  }
  if (((ppStack_18->flags & 0x802000) == 0) && (ppStack_18->top_backref < 0x81)) {
    local_278[0] = 0;
    local_284 = find_minlength(ppStack_18,_ucp,_ucp,depth,(recurse_check *)0x0,
                               (int *)((long)&code + 4),local_278);
    if (local_284 == -3) {
      return 3;
    }
    if (local_284 == -2) {
      return 2;
    }
    if (local_284 != -1) {
      if (0xffff < local_284) {
        local_284 = 0xffff;
      }
      ppStack_18->minlength = (uint16_t)local_284;
    }
  }
  return 0;
}

Assistant:

int
PRIV(study)(pcre2_real_code *re)
{
int count = 0;
PCRE2_UCHAR *code;
BOOL utf = (re->overall_options & PCRE2_UTF) != 0;
BOOL ucp = (re->overall_options & PCRE2_UCP) != 0;

/* Find start of compiled code */

code = (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
  re->name_entry_size * re->name_count;

/* For a pattern that has a first code unit, or a multiline pattern that
matches only at "line start", there is no point in seeking a list of starting
code units. */

if ((re->flags & (PCRE2_FIRSTSET|PCRE2_STARTLINE)) == 0)
  {
  int depth = 0;
  int rc = set_start_bits(re, code, utf, ucp, &depth);
  if (rc == SSB_UNKNOWN) return 1;

  /* If a list of starting code units was set up, scan the list to see if only
  one or two were listed. Having only one listed is rare because usually a
  single starting code unit will have been recognized and PCRE2_FIRSTSET set.
  If two are listed, see if they are caseless versions of the same character;
  if so we can replace the list with a caseless first code unit. This gives
  better performance and is plausibly worth doing for patterns such as [Ww]ord
  or (word|WORD). */

  if (rc == SSB_DONE)
    {
    int i;
    int a = -1;
    int b = -1;
    uint8_t *p = re->start_bitmap;
    uint32_t flags = PCRE2_FIRSTMAPSET;

    for (i = 0; i < 256; p++, i += 8)
      {
      uint8_t x = *p;
      if (x != 0)
        {
        int c;
        uint8_t y = x & (~x + 1);   /* Least significant bit */
        if (y != x) goto DONE;      /* More than one bit set */

        /* In the 16-bit and 32-bit libraries, the bit for 0xff means "0xff and
        all wide characters", so we cannot use it here. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        if (i == 248 && x == 0x80) goto DONE;
#endif

        /* Compute the character value */

        c = i;
        switch (x)
          {
          case 1:   break;
          case 2:   c += 1; break;  case 4:  c += 2; break;
          case 8:   c += 3; break;  case 16: c += 4; break;
          case 32:  c += 5; break;  case 64: c += 6; break;
          case 128: c += 7; break;
          }

        /* c contains the code unit value, in the range 0-255. In 8-bit UTF
        mode, only values < 128 can be used. In all the other cases, c is a
        character value. */

#if PCRE2_CODE_UNIT_WIDTH == 8
        if (utf && c > 127) goto DONE;
#endif
        if (a < 0) a = c;   /* First one found, save in a */
        else if (b < 0)     /* Second one found */
          {
          int d = TABLE_GET((unsigned int)c, re->tables + fcc_offset, c);

#ifdef SUPPORT_UNICODE
          if (utf || ucp)
            {
            if (UCD_CASESET(c) != 0) goto DONE;     /* Multiple case set */
            if (c > 127) d = UCD_OTHERCASE(c);
            }
#endif  /* SUPPORT_UNICODE */

          if (d != a) goto DONE;   /* Not the other case of a */
          b = c;                   /* Save second in b */
          }
        else goto DONE;   /* More than two characters found */
        }
      }

    /* Replace the start code unit bits with a first code unit, but only if it
    is not the same as a required later code unit. This is because a search for
    a required code unit starts after an explicit first code unit, but at a
    code unit found from the bitmap. Patterns such as /a*a/ don't work
    if both the start unit and required unit are the same. */

    if (a >= 0 &&
        (
        (re->flags & PCRE2_LASTSET) == 0 ||
          (
          re->last_codeunit != (uint32_t)a &&
          (b < 0 || re->last_codeunit != (uint32_t)b)
          )
        ))
      {
      re->first_codeunit = a;
      flags = PCRE2_FIRSTSET;
      if (b >= 0) flags |= PCRE2_FIRSTCASELESS;
      }

    DONE:
    re->flags |= flags;
    }
  }

/* Find the minimum length of subject string. If the pattern can match an empty
string, the minimum length is already known. If the pattern contains (*ACCEPT)
all bets are off, and we don't even try to find a minimum length. If there are
more back references than the size of the vector we are going to cache them in,
do nothing. A pattern that complicated will probably take a long time to
analyze and may in any case turn out to be too complicated. Note that back
reference minima are held as 16-bit numbers. */

if ((re->flags & (PCRE2_MATCH_EMPTY|PCRE2_HASACCEPT)) == 0 &&
     re->top_backref <= MAX_CACHE_BACKREF)
  {
  int min;
  int backref_cache[MAX_CACHE_BACKREF+1];
  backref_cache[0] = 0;    /* Highest one that is set */
  min = find_minlength(re, code, code, utf, NULL, &count, backref_cache);
  switch(min)
    {
    case -1:  /* \C in UTF mode or over-complex regex */
    break;    /* Leave minlength unchanged (will be zero) */

    case -2:
    return 2; /* missing capturing bracket */

    case -3:
    return 3; /* unrecognized opcode */

    default:
    re->minlength = (min > UINT16_MAX)? UINT16_MAX : min;
    break;
    }
  }

return 0;
}